

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O1

int writeString(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json
               )

{
  CURLINFO CVar1;
  writeoutid wVar2;
  bool bVar3;
  FILE *stream_00;
  char cVar4;
  int iVar5;
  CURLcode CVar6;
  long lVar7;
  curl_certinfo *pcVar8;
  size_t sVar9;
  int *piVar10;
  uint uVar11;
  bool bVar12;
  char *pcVar13;
  undefined3 in_register_00000081;
  undefined4 uVar14;
  curl_slist *pcVar15;
  long version;
  dynbuf buf;
  char *local_90;
  undefined4 local_84;
  char *local_80;
  per_transfer *local_78;
  FILE *local_70;
  writeoutvar *local_68;
  char *local_60;
  long local_58;
  dynbuf local_50;
  
  uVar14 = CONCAT31(in_register_00000081,use_json);
  local_90 = (char *)0x0;
  curlx_dyn_init(&local_50,0x40000);
  CVar1 = wovar->ci;
  local_84 = uVar14;
  local_70 = (FILE *)stream;
  local_68 = wovar;
  if (CVar1 == CURLINFO_NONE) {
    wVar2 = wovar->id;
    uVar11 = wVar2 - VAR_INPUT_URLSCHEME;
    if (uVar11 < 0x14) {
      if (per->url != (char *)0x0) {
        lVar7 = curl_url();
        if (lVar7 == 0) {
          bVar12 = false;
        }
        else {
          cVar4 = '\0';
          local_80 = (char *)0x0;
          local_60 = (char *)0x0;
          if (wVar2 < VAR_INPUT_URLESCHEME) {
            local_60 = per->url;
            bVar12 = true;
          }
          else {
            iVar5 = curl_easy_getinfo(per->curl,0x100001,&local_60);
            bVar12 = iVar5 == 0;
            cVar4 = !bVar12 * '\x05';
          }
          uVar14 = 5;
          if ((bVar12) && (cVar4 = '\x04', uVar11 < 0x14)) {
            uVar14 = *(undefined4 *)(&DAT_0012ade0 + (ulong)uVar11 * 4);
            cVar4 = '\0';
          }
          if (cVar4 == '\0') {
            bVar12 = false;
            iVar5 = curl_url_set(lVar7,0,local_60,0x208);
            if (iVar5 == 0) {
              iVar5 = curl_url_get(lVar7,uVar14,&local_80,1);
              bVar12 = iVar5 == 0;
            }
          }
          else {
            bVar12 = false;
          }
          if ((bool)(local_80 != (char *)0x0 & bVar12)) {
            local_90 = local_80;
          }
          curl_url_cleanup(lVar7);
        }
        pcVar13 = local_90;
        if (bVar12) goto LAB_0011f3a3;
        goto LAB_0011f38d;
      }
    }
    else {
      bVar12 = false;
      pcVar13 = (char *)0x0;
      if ((int)wVar2 < 10) {
        if (wVar2 == VAR_CERT) {
          certinfo(per);
          if (per->certinfo != (curl_certinfo *)0x0) {
            pcVar8 = per->certinfo;
            if (pcVar8->num_of_certs < 1) {
              bVar12 = false;
            }
            else {
              lVar7 = 0;
              bVar12 = false;
              local_78 = per;
              do {
                local_58 = lVar7;
                for (pcVar15 = pcVar8->certinfo[lVar7]; pcVar15 != (curl_slist *)0x0;
                    pcVar15 = pcVar15->next) {
                  iVar5 = curl_strnequal(pcVar15->data,"cert:",5);
                  pcVar13 = pcVar15->data;
                  if (iVar5 != 0) {
                    pcVar13 = pcVar13 + 5;
                  }
                  CVar6 = curlx_dyn_add(&local_50,pcVar13);
                  if (CVar6 == CURLE_OK) {
                    sVar9 = curlx_dyn_len(&local_50);
                    bVar3 = true;
                    per = local_78;
                    if (((sVar9 != 0) &&
                        (pcVar13 = curlx_dyn_ptr(&local_50), per = local_78,
                        pcVar13[sVar9 - 1] != '\n')) &&
                       (CVar6 = curlx_dyn_addn(&local_50,"\n",1), per = local_78, CVar6 != CURLE_OK)
                       ) {
                      bVar12 = true;
                      bVar3 = false;
                    }
                  }
                  else {
                    bVar12 = true;
                    bVar3 = false;
                  }
                  if (!bVar3) break;
                }
                lVar7 = local_58 + 1;
                pcVar8 = per->certinfo;
              } while ((lVar7 < pcVar8->num_of_certs) && (!bVar12));
            }
            if (!bVar12) {
              pcVar13 = curlx_dyn_ptr(&local_50);
              local_90 = "";
              if (pcVar13 != (char *)0x0) {
                local_90 = pcVar13;
              }
            }
            bVar12 = (bool)(bVar12 ^ 1);
            goto LAB_0011f38d;
          }
          local_90 = "";
        }
        else {
          if (wVar2 != VAR_EFFECTIVE_FILENAME) goto LAB_0011f3a3;
          pcVar13 = (per->outs).filename;
LAB_0011f24b:
          if (pcVar13 != (char *)0x0) goto LAB_0011f38a;
        }
      }
      else {
        if (wVar2 != VAR_ERRORMSG) {
          if (wVar2 != VAR_INPUT_URL) goto LAB_0011f3a3;
          pcVar13 = per->url;
          goto LAB_0011f24b;
        }
        if (per_result != CURLE_OK) {
          pcVar13 = per->errorbuffer;
          if ((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) {
            pcVar13 = (char *)curl_easy_strerror(per_result);
          }
          goto LAB_0011f38a;
        }
      }
    }
    bVar12 = false;
    pcVar13 = (char *)0x0;
  }
  else {
    if (CVar1 != CURLINFO_HTTP_VERSION) {
      iVar5 = curl_easy_getinfo(per->curl,CVar1,&local_90);
      bVar12 = local_90 != (char *)0x0 && iVar5 == 0;
      pcVar13 = (char *)0x0;
      goto LAB_0011f3a3;
    }
    local_80 = (char *)0x0;
    bVar12 = false;
    iVar5 = curl_easy_getinfo(per->curl,0x20002e);
    if (iVar5 == 0) {
      if (local_80 == (char *)0x0) {
        pcVar13 = "0";
      }
      else {
        piVar10 = &http_version[1].num;
        do {
          pcVar13 = ((httpmap *)(piVar10 + -2))->str;
          bVar12 = pcVar13 != (char *)0x0;
          if (pcVar13 == (char *)0x0) goto LAB_0011f38d;
          iVar5 = *piVar10;
          piVar10 = piVar10 + 4;
        } while (local_80 != (char *)(long)iVar5);
      }
LAB_0011f38a:
      local_90 = pcVar13;
      bVar12 = true;
    }
LAB_0011f38d:
    pcVar13 = (char *)0x0;
  }
LAB_0011f3a3:
  stream_00 = local_70;
  if ((bool)(local_90 != (char *)0x0 & bVar12)) {
    if ((char)local_84 == '\0') {
      fputs(local_90,local_70);
    }
    else {
      curl_mfprintf(local_70,"\"%s\":",local_68->name);
      jsonWriteString((FILE *)stream_00,local_90,false);
    }
  }
  else if ((char)local_84 != '\0') {
    curl_mfprintf(local_70,"\"%s\":null",local_68->name);
  }
  curl_free(pcVar13);
  curlx_dyn_free(&local_50);
  return 1;
}

Assistant:

static int writeString(FILE *stream, const struct writeoutvar *wovar,
                       struct per_transfer *per, CURLcode per_result,
                       bool use_json)
{
  bool valid = false;
  const char *strinfo = NULL;
  const char *freestr = NULL;
  struct dynbuf buf;
  curlx_dyn_init(&buf, 256*1024);

  DEBUGASSERT(wovar->writefunc == writeString);

  if(wovar->ci) {
    if(wovar->ci == CURLINFO_HTTP_VERSION) {
      long version = 0;
      if(!curl_easy_getinfo(per->curl, CURLINFO_HTTP_VERSION, &version)) {
        const struct httpmap *m = &http_version[0];
        while(m->str) {
          if(m->num == version) {
            strinfo = m->str;
            valid = true;
            break;
          }
          m++;
        }
      }
    }
    else {
      if(!curl_easy_getinfo(per->curl, wovar->ci, &strinfo) && strinfo)
        valid = true;
    }
  }
  else {
    switch(wovar->id) {
    case VAR_CERT:
      certinfo(per);
      if(per->certinfo) {
        int i;
        bool error = FALSE;
        for(i = 0; (i < per->certinfo->num_of_certs) && !error; i++) {
          struct curl_slist *slist;

          for(slist = per->certinfo->certinfo[i]; slist; slist = slist->next) {
            size_t len;
            if(curl_strnequal(slist->data, "cert:", 5)) {
              if(curlx_dyn_add(&buf, &slist->data[5])) {
                error = TRUE;
                break;
              }
            }
            else {
              if(curlx_dyn_add(&buf, slist->data)) {
                error = TRUE;
                break;
              }
            }
            len = curlx_dyn_len(&buf);
            if(len) {
              char *ptr = curlx_dyn_ptr(&buf);
              if(ptr[len -1] != '\n') {
                /* add a newline to make things look better */
                if(curlx_dyn_addn(&buf, "\n", 1)) {
                  error = TRUE;
                  break;
                }
              }
            }
          }
        }
        if(!error) {
          strinfo = curlx_dyn_ptr(&buf);
          if(!strinfo)
            /* maybe not a TLS protocol */
            strinfo = "";
          valid = true;
        }
      }
      else
        strinfo = ""; /* no cert info */
      break;
    case VAR_ERRORMSG:
      if(per_result) {
        strinfo = (per->errorbuffer && per->errorbuffer[0]) ?
          per->errorbuffer : curl_easy_strerror(per_result);
        valid = true;
      }
      break;
    case VAR_EFFECTIVE_FILENAME:
      if(per->outs.filename) {
        strinfo = per->outs.filename;
        valid = true;
      }
      break;
    case VAR_INPUT_URL:
      if(per->url) {
        strinfo = per->url;
        valid = true;
      }
      break;
    case VAR_INPUT_URLSCHEME:
    case VAR_INPUT_URLUSER:
    case VAR_INPUT_URLPASSWORD:
    case VAR_INPUT_URLOPTIONS:
    case VAR_INPUT_URLHOST:
    case VAR_INPUT_URLPORT:
    case VAR_INPUT_URLPATH:
    case VAR_INPUT_URLQUERY:
    case VAR_INPUT_URLFRAGMENT:
    case VAR_INPUT_URLZONEID:
    case VAR_INPUT_URLESCHEME:
    case VAR_INPUT_URLEUSER:
    case VAR_INPUT_URLEPASSWORD:
    case VAR_INPUT_URLEOPTIONS:
    case VAR_INPUT_URLEHOST:
    case VAR_INPUT_URLEPORT:
    case VAR_INPUT_URLEPATH:
    case VAR_INPUT_URLEQUERY:
    case VAR_INPUT_URLEFRAGMENT:
    case VAR_INPUT_URLEZONEID:
      if(per->url) {
        if(!urlpart(per, wovar->id, &strinfo)) {
          freestr = strinfo;
          valid = true;
        }
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  DEBUGASSERT(!valid || strinfo);
  if(valid && strinfo) {
    if(use_json) {
      fprintf(stream, "\"%s\":", wovar->name);
      jsonWriteString(stream, strinfo, FALSE);
    }
    else
      fputs(strinfo, stream);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }
  curl_free((char *)CURL_UNCONST(freestr));

  curlx_dyn_free(&buf);
  return 1; /* return 1 if anything was written */
}